

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::_::
Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++:410:3)>
::~Deferred(Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:410:3)>
            *this)

{
  bool *pbVar1;
  Mutex *pMVar2;
  Waiter *pWVar3;
  Waiter *pWVar4;
  Maybe<kj::_::Mutex::Waiter_&> *pMVar5;
  Waiter *_next106;
  Maybe<kj::_::Mutex::Waiter_&> **ppMVar6;
  
  if ((this->maybeFunc).ptr.isSet == true) {
    pbVar1 = (this->maybeFunc).ptr.field_1.value.currentlyLocked;
    pMVar2 = (this->maybeFunc).ptr.field_1.value.this;
    pWVar3 = (this->maybeFunc).ptr.field_1.value.waiter;
    (this->maybeFunc).ptr.isSet = false;
    if (*pbVar1 == false) {
      Mutex::lock(pMVar2,0);
    }
    pWVar4 = (pWVar3->next).ptr;
    pMVar5 = pWVar3->prev;
    pMVar5->ptr = pWVar4;
    ppMVar6 = &pWVar4->prev;
    if (pWVar4 == (Waiter *)0x0) {
      ppMVar6 = &pMVar2->waitersTail;
    }
    *ppMVar6 = pMVar5;
  }
  return;
}

Assistant:

inline NullableValue(NullableValue&& other)
      : isSet(other.isSet) {
    if (isSet) {
      ctor(value, kj::mv(other.value));
    }
  }